

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O0

pair<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node_*,_long>
 __thiscall
sjtu::
DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
::newspace(DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
           *this)

{
  streamoff sVar1;
  long in_RDI;
  pair<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node_*,_long>
  pVar2;
  LRUCache<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
  *unaff_retaddr;
  node tmp;
  locType offset_;
  locType offset;
  streamoff in_stack_fffffffffffff638;
  long *__y;
  fpos<__mbstate_t> *in_stack_fffffffffffff640;
  node *in_stack_fffffffffffff650;
  undefined8 local_9a8;
  undefined8 local_9a0;
  fpos local_998 [16];
  undefined1 local_988 [2400];
  long local_28;
  long local_20 [2];
  locType *local_10;
  locType *offset_00;
  
  offset_00 = local_10;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  ::node::node(in_stack_fffffffffffff650);
  std::istream::seekg(in_RDI + 8,_S_beg);
  std::istream::read((char *)(in_RDI + 8),(long)local_20);
  std::ostream::seekp(in_RDI + 0x18,_S_beg);
  std::ios::clear(in_RDI + 8 + *(long *)(*(long *)(in_RDI + 8) + -0x18),0);
  local_998 = (fpos  [16])std::ostream::tellp();
  sVar1 = std::fpos::operator_cast_to_long(local_998);
  if (sVar1 == local_20[0]) {
    std::ostream::write((char *)(in_RDI + 0x18),(long)local_988);
    local_28 = local_20[0] + 0x960;
    std::ostream::seekp(in_RDI + 0x18,_S_beg);
    std::ostream::write((char *)(in_RDI + 0x18),(long)local_988);
    std::ostream::seekp(in_RDI + 0x18,0xfffff6a0);
    std::ostream::write((char *)(in_RDI + 0x18),(long)&local_28);
  }
  else {
    in_stack_fffffffffffff640 = (fpos<__mbstate_t> *)(in_RDI + 8);
    std::fpos<__mbstate_t>::fpos(in_stack_fffffffffffff640,in_stack_fffffffffffff638);
    std::istream::seekg(in_stack_fffffffffffff640,local_9a8,local_9a0);
    std::istream::read((char *)(in_RDI + 8),(long)&local_28);
    std::ostream::seekp(in_RDI + 0x18,_S_beg);
    std::ostream::write((char *)(in_RDI + 0x18),(long)&local_28);
  }
  __y = local_20;
  LRUCache<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
  ::load(unaff_retaddr,offset_00);
  pVar2 = std::
          make_pair<sjtu::BplusTree<std::pair<unsigned_long_long,int>,long,100,std::less<std::pair<unsigned_long_long,int>>>::node*,long&>
                    ((node **)in_stack_fffffffffffff640,__y);
  return pVar2;
}

Assistant:

virtual std::pair<T * , locType> newspace() override
		{
			locType offset , offset_;T tmp;
			file.seekg(0 , std::ios_base::beg) , file.read(reinterpret_cast<char *> (&offset) , sizeof (locType));
			file.seekp(0 , std::ios_base::end) , file.clear();
			if (file.tellp() == offset)
			{
				file.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
				offset_ = offset + sizeof (T) , file.seekp(0 , std::ios_base::beg);
				file.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
				file.seekp(- sizeof (T) , std::ios_base::cur) , file.write(reinterpret_cast<char *> (&offset_) , sizeof (locType));
			}
			else
			{
				file.seekg(offset) , file.read(reinterpret_cast<char *> (&offset_) , sizeof (locType));
				//file.seekp(offset) , file.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
				file.seekp(0 , std::ios_base::beg) , file.write(reinterpret_cast<char *> (&offset_) , sizeof (locType));
			}
			return std::make_pair(cache -> load(offset) , offset);
		}